

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

LOs __thiscall Omega_h::get_elem_class_ids(Omega_h *this,Mesh *mesh)

{
  bool bVar1;
  Int ent_dim;
  uint uVar2;
  LO size_in;
  void *extraout_RDX;
  LOs LVar3;
  allocator local_39;
  string local_38;
  
  ent_dim = Mesh::dim(mesh);
  std::__cxx11::string::string((string *)&local_38,"class_id",&local_39);
  bVar1 = Mesh::has_tag(mesh,ent_dim,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    uVar2 = Mesh::dim(mesh);
    std::__cxx11::string::string((string *)&local_38,"class_id",&local_39);
    Mesh::get_array<int>((Mesh *)this,(Int)mesh,(string *)(ulong)uVar2);
  }
  else {
    size_in = Mesh::nelems(mesh);
    std::__cxx11::string::string((string *)&local_38,"",&local_39);
    Read<int>::Read((Read<int> *)this,size_in,1,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  LVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar3.write_.shared_alloc_;
}

Assistant:

static LOs get_elem_class_ids(Mesh* mesh) {
  if (mesh->has_tag(mesh->dim(), "class_id")) {
    return mesh->get_array<ClassId>(mesh->dim(), "class_id");
  } else {
    return LOs(mesh->nelems(), 1);
  }
}